

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O0

string * __thiscall Geodesic::toString_abi_cxx11_(Geodesic *this)

{
  ostream *poVar1;
  string *in_RDI;
  double dVar2;
  ostringstream ss;
  string local_1b8 [40];
  Geodesic *in_stack_fffffffffffffe70;
  ostringstream local_188 [240];
  RatioSequence *in_stack_ffffffffffffff68;
  RatioSequence *in_stack_ffffffffffffffe8;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  dVar2 = getDist(in_stack_fffffffffffffe70);
  poVar1 = (ostream *)std::ostream::operator<<(local_188,dVar2);
  poVar1 = std::operator<<(poVar1,"; ");
  RatioSequence::getNonDesRSWithMinDist(in_stack_ffffffffffffff68);
  RatioSequence::toString_abi_cxx11_(in_stack_ffffffffffffffe8);
  std::operator<<(poVar1,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  RatioSequence::~RatioSequence((RatioSequence *)0x1cdf07);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

string Geodesic::toString() {
    ostringstream ss;
    ss << getDist() << "; " << rs.getNonDesRSWithMinDist().toString();
    return ss.str();
}